

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O2

QAbstractItemModel * createTreeModel(QObject *parent)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QStandardItemModel *this;
  int a;
  QArrayDataPointer<char16_t> local_138;
  QArrayDataPointer<char16_t> local_120;
  anon_union_24_3_e3d07ef4_for_data local_108;
  QArrayDataPointer<char16_t> local_e8;
  QModelIndex grandParIdx;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QModelIndex parIdx;
  
  this = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this,parent);
  local_108._forAlignment = -NAN;
  local_108._8_8_ = 0;
  local_108._16_8_ = 0;
  (**(code **)(*(long *)this + 0x100))(this,0,3,&local_108);
  local_108._forAlignment = -NAN;
  local_108._8_8_ = 0;
  local_108._16_8_ = 0;
  a = 0;
  (**(code **)(*(long *)this + 0xf8))(this,0,3,&local_108);
  while( true ) {
    local_108._forAlignment = -NAN;
    local_108._8_8_ = 0;
    local_108._16_8_ = 0;
    iVar1 = (**(code **)(*(long *)this + 0x78))();
    if (iVar1 <= a) break;
    iVar1 = 0;
    while( true ) {
      local_108._forAlignment = -NAN;
      local_108._8_8_ = 0;
      local_108._16_8_ = 0;
      iVar2 = (**(code **)(*(long *)this + 0x80))(this,&local_108);
      if (iVar2 <= iVar1) break;
      grandParIdx.r = -1;
      grandParIdx.c = -1;
      grandParIdx.i = 0;
      grandParIdx.m = (QAbstractItemModel *)0x0;
      (**(code **)(*(long *)this + 0x60))(&parIdx,this,a,iVar1,&grandParIdx);
      local_120.d = (Data *)0x0;
      local_120.ptr = L"%1,%2";
      local_120.size = 5;
      local_138.d = (Data *)0x0;
      local_138.ptr = (char16_t *)0x0;
      local_138.size = 0;
      QString::arg((QString *)&local_e8,(QString *)&local_120,a,0,10,(QChar)0x20);
      QString::arg((QString *)&local_80,(QString *)&local_e8,iVar1,0,10,(QChar)0x20);
      QVariant::QVariant((QVariant *)&local_108,(QString *)&local_80);
      (**(code **)(*(long *)this + 0x98))(this,&parIdx,&local_108);
      QVariant::~QVariant((QVariant *)&local_108);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
      iVar1 = iVar1 + 1;
    }
    local_108._forAlignment = -NAN;
    local_108._8_8_ = 0;
    local_108._16_8_ = 0;
    iVar1 = 0;
    (**(code **)(*(long *)this + 0x60))(&parIdx,this,a,0);
    (**(code **)(*(long *)this + 0x100))(this,0,2,&parIdx);
    (**(code **)(*(long *)this + 0xf8))(this,0,4);
    while( true ) {
      iVar2 = (**(code **)(*(long *)this + 0x78))(this,&parIdx);
      if (iVar2 <= iVar1) break;
      iVar2 = 0;
      while( true ) {
        iVar3 = (**(code **)(*(long *)this + 0x80))(this,&parIdx);
        if (iVar3 <= iVar2) break;
        (**(code **)(*(long *)this + 0x60))(&grandParIdx,this,iVar1,iVar2,&parIdx);
        local_138.d = (Data *)0x0;
        local_138.ptr = L"%1,%2,%3";
        local_138.size = 8;
        local_b8.d = (Data *)0x0;
        local_b8.ptr = (char16_t *)0x0;
        local_b8.size = 0;
        QString::arg((QString *)&local_120,(QString *)&local_138,a,0,10,(QChar)0x20);
        QString::arg((QString *)&local_e8,(QString *)&local_120,iVar1,0,10,(QChar)0x20);
        QString::arg((QString *)&local_80,(QString *)&local_e8,iVar2,0,10,(QChar)0x20);
        QVariant::QVariant((QVariant *)&local_108,(QString *)&local_80);
        (**(code **)(*(long *)this + 0x98))(this,&grandParIdx,&local_108);
        QVariant::~QVariant((QVariant *)&local_108);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        iVar2 = iVar2 + 1;
      }
      iVar2 = 0;
      (**(code **)(*(long *)this + 0x60))(&grandParIdx,this,a,0,&parIdx);
      (**(code **)(*(long *)this + 0x100))(this,0,2,&grandParIdx);
      (**(code **)(*(long *)this + 0xf8))(this,0,6);
      while( true ) {
        iVar3 = (**(code **)(*(long *)this + 0x78))(this,&grandParIdx);
        if (iVar3 <= iVar2) break;
        iVar3 = 0;
        while( true ) {
          iVar4 = (**(code **)(*(long *)this + 0x80))(this,&grandParIdx);
          if (iVar4 <= iVar3) break;
          (**(code **)(*(long *)this + 0x60))(&local_80,this,iVar2,iVar3,&grandParIdx);
          local_98.d = (Data *)0x0;
          local_98.ptr = L"%1,%2,%3,%4";
          local_98.size = 0xb;
          local_68.d = (Data *)0x0;
          local_68.ptr = (char16_t *)0x0;
          local_68.size = 0;
          QString::arg((QString *)&local_b8,(QString *)&local_98,a,0,10,(QChar)0x20);
          QString::arg((QString *)&local_138,(QString *)&local_b8,iVar1,0,10,(QChar)0x20);
          QString::arg((QString *)&local_120,(QString *)&local_138,iVar2,0,10,(QChar)0x20);
          QString::arg((QString *)&local_e8,(QString *)&local_120,iVar3,0,10,(QChar)0x20);
          QVariant::QVariant((QVariant *)&local_108,(QString *)&local_e8);
          (**(code **)(*(long *)this + 0x98))(this,&local_80,&local_108);
          QVariant::~QVariant((QVariant *)&local_108);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
          iVar3 = iVar3 + 1;
        }
        iVar2 = iVar2 + 1;
      }
      iVar1 = iVar1 + 1;
    }
    a = a + 1;
  }
  return (QAbstractItemModel *)this;
}

Assistant:

QAbstractItemModel *createTreeModel(QObject *parent)
{
    QAbstractItemModel *result = nullptr;
#ifdef COMPLEX_MODEL_SUPPORT
    result = new ComplexModel(parent);
    result->insertColumns(0, 3);
    result->insertRows(0, 3);
    for (int i = 0; i < result->rowCount(); ++i) {
        for (int j = 0; j < result->columnCount(); ++j)
            result->setData(result->index(i, j), QStringLiteral("%1,%2").arg(i).arg(j));
        const QModelIndex parIdx = result->index(i, 0);
        result->insertColumns(0, 2, parIdx);
        result->insertRows(0, 4, parIdx);
        for (int k = 0; k < result->rowCount(parIdx); ++k) {
            for (int h = 0; h < result->columnCount(parIdx); ++h)
                result->setData(result->index(k, h, parIdx), QStringLiteral("%1,%2,%3").arg(i).arg(k).arg(h));
            const QModelIndex grandParIdx = result->index(i, 0, parIdx);
            result->insertColumns(0, 2, grandParIdx);
            result->insertRows(0, 6, grandParIdx);
            for (int j = 0; j < result->rowCount(grandParIdx); ++j) {
                for (int h = 0; h < result->columnCount(grandParIdx); ++h)
                    result->setData(result->index(j, h, grandParIdx), QStringLiteral("%1,%2,%3,%4").arg(i).arg(k).arg(j).arg(h));
            }
        }
    }
#endif
    return result;
}